

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::PatchablePropertyWithThisPtr
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,RegSlot thisInstance,
          uint cacheId,bool isCtor,bool registerCacheIdForCall)

{
  code *pcVar1;
  bool bVar2;
  RegSlot instance_00;
  RegSlot value2;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  Phase phase;
  CacheIdUnit local_50;
  CacheIdUnit unit;
  RegSlot local_38;
  OpCode local_32 [4];
  OpCode op_local;
  
  local_32[0] = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x39);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x890,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_00893b01;
    *puVar3 = 0;
  }
  if (value != 0xffffffff) {
    pFVar4 = this->m_functionWrite;
    if (pFVar4 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_00893b01;
      *puVar3 = 0;
      pFVar4 = this->m_functionWrite;
    }
    local_38 = FunctionBody::MapRegSlot(pFVar4,value);
    if (instance != 0xffffffff) {
      pFVar4 = this->m_functionWrite;
      if (pFVar4 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar2) goto LAB_00893b01;
        *puVar3 = 0;
        pFVar4 = this->m_functionWrite;
      }
      instance_00 = FunctionBody::MapRegSlot(pFVar4,instance);
      if (thisInstance != 0xffffffff) {
        pFVar4 = this->m_functionWrite;
        if (pFVar4 == (FunctionBody *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
          if (!bVar2) goto LAB_00893b01;
          *puVar3 = 0;
          pFVar4 = this->m_functionWrite;
        }
        value2 = FunctionBody::MapRegSlot(pFVar4,thisInstance);
        if ((op == StSuperFldStrict) || (op == StSuperFld)) {
          bVar2 = DynamicProfileInfo::IsEnabled(ProfileBasedFldFastPathPhase,this->m_functionWrite);
          if (!bVar2) {
            bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false);
            if (!bVar2) {
              pFVar4 = this->m_functionWrite;
              phase = ObjTypeSpecPhase;
LAB_008939c3:
              bVar2 = DynamicProfileInfo::IsEnabled(phase,pFVar4);
              if (!bVar2) goto LAB_00893a2c;
            }
          }
        }
        else {
          if (op != LdSuperFld) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar3 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                        ,0x8b5,"(false)",
                                        "The specified OpCode is not intended for patchable super field-access"
                                       );
            if (!bVar2) goto LAB_00893b01;
            *puVar3 = 0;
            goto LAB_00893a2c;
          }
          if (registerCacheIdForCall && isCtor) {
            local_50._4_4_ = local_50._4_4_ & 0xffffff00;
            local_50.cacheId = cacheId;
            bVar2 = JsUtil::
                    BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::TryGetValue<unsigned_int>
                              (this->callRegToLdFldCacheIndexMap,&local_38,&local_50);
            if (bVar2) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar3 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                          ,0x89e,
                                          "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))"
                                          ,"!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)"
                                         );
              if (!bVar2) goto LAB_00893b01;
              *puVar3 = 0;
            }
            JsUtil::
            BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                      ((BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this->callRegToLdFldCacheIndexMap,&local_38,&local_50);
          }
          bVar2 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
          if (!bVar2) {
            bVar2 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite);
            if (!bVar2) {
              bVar2 = DynamicProfileInfo::IsEnabled(ObjTypeSpecPhase,this->m_functionWrite);
              if (!bVar2) {
                bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false);
                if (!bVar2) {
                  pFVar4 = this->m_functionWrite;
                  phase = ProfileBasedFldFastPathPhase;
                  goto LAB_008939c3;
                }
              }
            }
          }
        }
        OpCodeUtil::ConvertNonCallOpToProfiled(local_32);
LAB_00893a2c:
        bVar2 = TryWriteElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,local_32[0],local_38,instance_00,cacheId,value2);
        if (!bVar2) {
          bVar2 = TryWriteElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,local_32[0],local_38,instance_00,cacheId,value2);
          if (!bVar2) {
            local_50.cacheId = local_38;
            local_50._4_4_ = instance_00;
            unit.cacheId = value2;
            unit._4_4_ = cacheId;
            Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,local_32[0],this);
            Data::Write(&this->m_byteCodeData,&local_50,0x10);
          }
        }
        return;
      }
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_00893b01:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::PatchablePropertyWithThisPtr(OpCode op, RegSlot value, RegSlot instance, RegSlot thisInstance, uint cacheId, bool isCtor, bool registerCacheIdForCall)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementC2);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        instance = ConsumeReg(instance);
        thisInstance = ConsumeReg(thisInstance);

        switch (op)
        {
        case OpCode::LdSuperFld:
            if (isCtor) // The symbol loaded by this LdSuperFld will be used as a constructor
            {
                if (registerCacheIdForCall)
                {
                    CacheIdUnit unit(cacheId);
                    Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                    callRegToLdFldCacheIndexMap->Add(value, unit);
                }
            }
            if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::StSuperFld:
        case OpCode::StSuperFldStrict:
            if (DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        default:
            AssertMsg(false, "The specified OpCode is not intended for patchable super field-access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementC2, op, value, instance, cacheId, thisInstance);
    }